

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

bool slang::literalBaseFromChar(char base,LiteralBase *result)

{
  LiteralBase LVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,base);
  LVar1 = Decimal;
  if (iVar2 < 0x62) {
    if (0x47 < iVar2) {
      if (iVar2 == 0x48) {
LAB_001a6b58:
        LVar1 = Hex;
        goto LAB_001a6b5a;
      }
      if (iVar2 != 0x4f) {
        return false;
      }
LAB_001a6b50:
      LVar1 = Octal;
      goto LAB_001a6b5a;
    }
    if (iVar2 != 0x42) {
      if (iVar2 != 0x44) {
        return false;
      }
      goto LAB_001a6b5a;
    }
  }
  else {
    if (0x67 < iVar2) {
      if (iVar2 == 0x68) goto LAB_001a6b58;
      if (iVar2 != 0x6f) {
        return false;
      }
      goto LAB_001a6b50;
    }
    if (iVar2 != 0x62) {
      if (iVar2 != 100) {
        return false;
      }
      goto LAB_001a6b5a;
    }
  }
  LVar1 = Binary;
LAB_001a6b5a:
  *result = LVar1;
  return true;
}

Assistant:

bool literalBaseFromChar(char base, LiteralBase& result) {
    switch (base) {
        case 'd':
        case 'D':
            result = LiteralBase::Decimal;
            return true;
        case 'b':
        case 'B':
            result = LiteralBase::Binary;
            return true;
        case 'o':
        case 'O':
            result = LiteralBase::Octal;
            return true;
        case 'h':
        case 'H':
            result = LiteralBase::Hex;
            return true;
        default:
            return false;
    }
}